

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  u8 enc;
  int iVar2;
  NameContext *pNVar3;
  Parse *pParse;
  SrcList *pSVar4;
  AggInfo *pAggInfo;
  Expr *pEVar5;
  ExprList *pEVar6;
  int iVar7;
  int iVar8;
  AggInfo_func *pAVar9;
  FuncDef *pFVar10;
  int iVar11;
  int *piVar12;
  uint uVar13;
  IndexedExpr *pIVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  int i;
  undefined1 local_88 [48];
  undefined8 local_58;
  AggInfo *pAStack_50;
  anon_union_8_3_c79b3df9_for_y local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar3 = (pWalker->u).pNC;
  pParse = pNVar3->pParse;
  pSVar4 = pNVar3->pSrcList;
  pAggInfo = (pNVar3->uNC).pAggInfo;
  bVar1 = pExpr->op;
  if (bVar1 < 0xaa) {
    if (bVar1 != 0xa8) {
      if (bVar1 == 0xa9) {
        iVar7 = 0;
        if ((((pNVar3->ncFlags & 0x20000) == 0) &&
            (iVar7 = 0, pWalker->walkerDepth == (uint)pExpr->op2)) &&
           (pExpr->pAggInfo == (AggInfo *)0x0)) {
          if (pAggInfo->nFunc < 1) {
            uVar15 = 0;
          }
          else {
            pAVar9 = pAggInfo->aFunc;
            uVar15 = 0;
            do {
              if ((pAVar9->pFExpr == pExpr) ||
                 (iVar7 = sqlite3ExprCompare((Parse *)0x0,pAVar9->pFExpr,pExpr,-1), iVar7 == 0))
              break;
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
              pAVar9 = pAVar9 + 1;
            } while ((int)uVar13 < pAggInfo->nFunc);
          }
          if (pAggInfo->nFunc <= (int)uVar15) {
            enc = pParse->db->enc;
            local_88._0_4_ = 0xaaaaaaaa;
            pAVar9 = (AggInfo_func *)
                     sqlite3ArrayAllocate
                               (pParse->db,pAggInfo->aFunc,0x20,&pAggInfo->nFunc,(int *)local_88);
            pAggInfo->aFunc = pAVar9;
            uVar15 = (ulong)(int)local_88._0_4_;
            if (-1 < (long)uVar15) {
              pAVar9[uVar15].pFExpr = pExpr;
              if ((pExpr->x).pList == (ExprList *)0x0) {
                iVar7 = 0;
              }
              else {
                iVar7 = ((pExpr->x).pList)->nExpr;
              }
              pFVar10 = sqlite3FindFunction(pParse->db,(pExpr->u).zToken,iVar7,enc,'\0');
              pAVar9[uVar15].pFunc = pFVar10;
              pEVar5 = pExpr->pLeft;
              if ((pEVar5 == (Expr *)0x0) || ((pFVar10->funcFlags & 0x20) != 0)) {
                pAVar9[uVar15].iOBTab = -1;
              }
              else {
                iVar8 = pParse->nTab;
                pParse->nTab = iVar8 + 1;
                pAVar9[uVar15].iOBTab = iVar8;
                if (((iVar7 == 1) && (pEVar6 = (pEVar5->x).pList, pEVar6->nExpr == 1)) &&
                   (iVar7 = sqlite3ExprCompare((Parse *)0x0,pEVar6->a[0].pExpr,
                                               ((pExpr->x).pList)->a[0].pExpr,0), iVar7 == 0)) {
                  pAVar9[uVar15].bOBPayload = '\0';
                  pAVar9[uVar15].bOBUnique = (byte)pExpr->flags >> 2 & 1;
                }
                else {
                  pAVar9[uVar15].bOBPayload = '\x01';
                }
                pAVar9[uVar15].bUseSubtype = (byte)((pAVar9[uVar15].pFunc)->funcFlags >> 0x14) & 1;
              }
              iVar7 = -1;
              if (((pExpr->flags & 4) != 0) && (pAVar9[uVar15].bOBUnique == '\0')) {
                iVar7 = pParse->nTab;
                pParse->nTab = iVar7 + 1;
              }
              pAVar9[uVar15].iDistinct = iVar7;
            }
          }
          pExpr->iAgg = (i16)uVar15;
          pExpr->pAggInfo = pAggInfo;
LAB_001a3f37:
          iVar7 = 1;
        }
        goto LAB_001a3d49;
      }
LAB_001a3cda:
      local_48.pTab = (Table *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      pAStack_50 = (AggInfo *)&DAT_aaaaaaaaaaaaaaaa;
      local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      iVar7 = 0;
      if (((pNVar3->ncFlags & 0x20000) != 0) &&
         (pIVar14 = pParse->pIdxEpr, pIVar14 != (IndexedExpr *)0x0)) {
        do {
          if ((-1 < pIVar14->iDataCur) &&
             (iVar7 = sqlite3ExprCompare((Parse *)0x0,pExpr,pIVar14->pExpr,pIVar14->iDataCur),
             iVar7 == 0)) {
            iVar8 = 0;
            iVar7 = 0;
            if (((pExpr->flags & 0x3000000) != 0) || (iVar2 = pSVar4->nSrc, iVar2 < 1))
            goto LAB_001a3d49;
            iVar11 = iVar2;
            goto LAB_001a3d89;
          }
          pIVar14 = pIVar14->pIENext;
        } while (pIVar14 != (IndexedExpr *)0x0);
        iVar7 = 0;
      }
      goto LAB_001a3d49;
    }
  }
  else if ((bVar1 != 0xaa) && (bVar1 != 0xb3)) goto LAB_001a3cda;
  iVar7 = 0;
  if ((pSVar4 != (SrcList *)0x0) && (iVar8 = pSVar4->nSrc, 0 < iVar8)) {
    piVar12 = &pSVar4->a[0].iCursor;
    do {
      if (pExpr->iTable == *piVar12) {
        findOrCreateAggInfoColumn(pParse,pAggInfo,pExpr);
        break;
      }
      piVar12 = piVar12 + 0x12;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
LAB_001a3d49:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
  while (iVar11 = iVar11 + -1, iVar11 != 0) {
LAB_001a3d89:
    iVar7 = iVar8;
    if (pSVar4->a[0].iCursor == pIVar14->iDataCur) {
      if (((0 < iVar2) && (pExpr->pAggInfo == (AggInfo *)0x0)) && (iVar7 = 2, pParse->nErr == 0)) {
        local_88._8_8_ = (char *)0x0;
        pAStack_50 = (AggInfo *)0x0;
        local_88._32_8_ = (ExprList *)0x0;
        local_88._16_8_ = (Expr *)0x0;
        local_88._24_8_ = (Expr *)0x0;
        local_48.pTab = (Table *)0x0;
        local_88._0_8_ = (undefined1 *)0xaa;
        local_88._40_8_ = (ulong)(uint)pIVar14->iIdxCur << 0x20;
        local_58 = (undefined1 *)(ulong)(ushort)pIVar14->iIdxCol;
        findOrCreateAggInfoColumn(pParse,pAggInfo,(Expr *)local_88);
        if (pParse->nErr == 0) {
          pAggInfo->aCol[local_58._2_2_].pCExpr = pExpr;
          pExpr->pAggInfo = pAggInfo;
          pExpr->iAgg = local_58._2_2_;
          goto LAB_001a3f37;
        }
      }
      break;
    }
  }
  goto LAB_001a3d49;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  assert( pAggInfo->iFirstReg==0 );
  switch( pExpr->op ){
    default: {
      IndexedExpr *pIEpr;
      Expr tmp;
      assert( pParse->iSelfTab==0 );
      if( (pNC->ncFlags & NC_InAggFunc)==0 ) break;
      if( pParse->pIdxEpr==0 ) break;
      for(pIEpr=pParse->pIdxEpr; pIEpr; pIEpr=pIEpr->pIENext){
        int iDataCur = pIEpr->iDataCur;
        if( iDataCur<0 ) continue;
        if( sqlite3ExprCompare(0, pExpr, pIEpr->pExpr, iDataCur)==0 ) break;
      }
      if( pIEpr==0 ) break;
      if( NEVER(!ExprUseYTab(pExpr)) ) break;
      for(i=0; i<pSrcList->nSrc; i++){
         if( pSrcList->a[0].iCursor==pIEpr->iDataCur ) break;
      }
      if( i>=pSrcList->nSrc ) break;
      if( NEVER(pExpr->pAggInfo!=0) ) break; /* Resolved by outer context */
      if( pParse->nErr ){ return WRC_Abort; }

      /* If we reach this point, it means that expression pExpr can be
      ** translated into a reference to an index column as described by
      ** pIEpr.
      */
      memset(&tmp, 0, sizeof(tmp));
      tmp.op = TK_AGG_COLUMN;
      tmp.iTable = pIEpr->iIdxCur;
      tmp.iColumn = pIEpr->iIdxCol;
      findOrCreateAggInfoColumn(pParse, pAggInfo, &tmp);
      if( pParse->nErr ){ return WRC_Abort; }
      assert( pAggInfo->aCol!=0 );
      assert( tmp.iAgg<pAggInfo->nColumn );
      pAggInfo->aCol[tmp.iAgg].pCExpr = pExpr;
      pExpr->pAggInfo = pAggInfo;
      pExpr->iAgg = tmp.iAgg;
      return WRC_Prune;
    }
    case TK_IF_NULL_ROW:
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        SrcItem *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            findOrCreateAggInfoColumn(pParse, pAggInfo, pExpr);
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Continue;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
       && pExpr->pAggInfo==0
      ){
        /* Check to see if pExpr is a duplicate of another aggregate
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( NEVER(pItem->pFExpr==pExpr) ) break;
          if( sqlite3ExprCompare(0, pItem->pFExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            int nArg;
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pFExpr = pExpr;
            assert( ExprUseUToken(pExpr) );
            nArg = pExpr->x.pList ? pExpr->x.pList->nExpr : 0;
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                                         pExpr->u.zToken, nArg, enc, 0);
            assert( pItem->bOBUnique==0 );
            if( pExpr->pLeft
             && (pItem->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)==0
            ){
              /* The NEEDCOLL test above causes any ORDER BY clause on
              ** aggregate min() or max() to be ignored. */
              ExprList *pOBList;
              assert( nArg>0 );
              assert( pExpr->pLeft->op==TK_ORDER );
              assert( ExprUseXList(pExpr->pLeft) );
              pItem->iOBTab = pParse->nTab++;
              pOBList = pExpr->pLeft->x.pList;
              assert( pOBList->nExpr>0 );
              assert( pItem->bOBUnique==0 );
              if( pOBList->nExpr==1
               && nArg==1
               && sqlite3ExprCompare(0,pOBList->a[0].pExpr,
                               pExpr->x.pList->a[0].pExpr,0)==0
              ){
                pItem->bOBPayload = 0;
                pItem->bOBUnique = ExprHasProperty(pExpr, EP_Distinct);
              }else{
                pItem->bOBPayload = 1;
              }
              pItem->bUseSubtype =
                    (pItem->pFunc->funcFlags & SQLITE_SUBTYPE)!=0;
            }else{
              pItem->iOBTab = -1;
            }
            if( ExprHasProperty(pExpr, EP_Distinct) && !pItem->bOBUnique ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}